

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.hpp
# Opt level: O3

void __thiscall
trex::
hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
register_type<Circle>
          (hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,t_type_info<Circle> *ti)

{
  pointer *pptVar1;
  size_t __n;
  char *__s2;
  int iVar2;
  long lVar3;
  type_info *ptVar4;
  type_info *ptVar5;
  iterator __position;
  byte bVar6;
  type_info local_78;
  
  bVar6 = 0;
  local_78.super_type_info.destroy = (ti->super_type_info).destroy;
  local_78.super_type_info.default_construct_at = (ti->super_type_info).default_construct_at;
  local_78.super_type_info.alloc_and_construct = (ti->super_type_info).alloc_and_construct;
  local_78.super_type_info.size = (ti->super_type_info).size;
  local_78.super_type_info.alignment = (ti->super_type_info).alignment;
  local_78.super_type_info.name._M_len = (ti->super_type_info).name._M_len;
  local_78.super_type_info.name._M_str = (ti->super_type_info).name._M_str;
  local_78.as_base = as_base<Circle>;
  local_78.construct_at_a = construct_at_a<Circle>;
  local_78.alloc_and_construct_a = alloc_and_construct_a<Circle>;
  ptVar4 = (this->m_registered_types).
           super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_registered_types).
       super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar4 != __position._M_current) {
    __n = (ti->super_type_info).name._M_len;
    __s2 = (ti->super_type_info).name._M_str;
    do {
      if (((ptVar4->super_type_info).name._M_len == __n) &&
         ((__n == 0 || (iVar2 = bcmp((ptVar4->super_type_info).name._M_str,__s2,__n), iVar2 == 0))))
      {
        ptVar5 = &local_78;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (ptVar4->super_type_info).name._M_len = *(size_t *)ptVar5;
          ptVar5 = (type_info *)((long)ptVar5 + ((ulong)bVar6 * -2 + 1) * 8);
          ptVar4 = (type_info *)((long)ptVar4 + (ulong)bVar6 * -0x10 + 8);
        }
        return;
      }
      ptVar4 = ptVar4 + 1;
    } while (ptVar4 != __position._M_current);
  }
  if (__position._M_current ==
      (this->m_registered_types).
      super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
    ::_M_realloc_insert<trex::hierarchy<Shape,std::__cxx11::string>::type_info>
              ((vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
                *)&this->m_registered_types,__position,&local_78);
  }
  else {
    ptVar4 = &local_78;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      ((__position._M_current)->super_type_info).name._M_len = *(size_t *)ptVar4;
      ptVar4 = (type_info *)((long)ptVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      __position._M_current = __position._M_current + (ulong)bVar6 * -0x10 + 8;
    }
    pptVar1 = &(this->m_registered_types).
               super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pptVar1 = *pptVar1 + 1;
  }
  return;
}

Assistant:

void register_type(const t_type_info<T>& ti)
    {
        static_assert(std::is_base_of<Base, T>::value, "Not a base class");

        priv::lock_guard l(m_register_mutex);

        type_info new_type_info;
        static_cast<trex::type_info&>(new_type_info) = ti;
        new_type_info.as_base = as_base<T>;
        new_type_info.construct_at_a = construct_at_a<T>;
        new_type_info.alloc_and_construct_a = alloc_and_construct_a<T>;

        // here we don't simply add the to the list
        // to support plugins and hot reloading, we override existing types
        for (auto& t : m_registered_types)
        {
            if (t.name == ti.name)
            {
                t = std::move(new_type_info);
                return;
            }
        }

        // type was not found, so add
        m_registered_types.emplace_back(std::move(new_type_info));
    }